

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

SimpleString __thiscall SimpleString::subString(SimpleString *this,size_t beginPos,size_t amount)

{
  size_t sVar1;
  ulong in_RCX;
  
  sVar1 = size((SimpleString *)beginPos);
  if (sVar1 - 1 < amount) {
    SimpleString(this,"");
  }
  else {
    SimpleString(this,(char *)(amount + *(long *)beginPos));
    sVar1 = size(this);
    if (in_RCX < sVar1) {
      this->buffer_[in_RCX] = '\0';
    }
  }
  return (SimpleString)(char *)this;
}

Assistant:

SimpleString SimpleString::subString(size_t beginPos, size_t amount) const
{
    if (beginPos > size()-1) return "";

    SimpleString newString = buffer_ + beginPos;

    if (newString.size() > amount)
        newString.buffer_[amount] = '\0';

    return newString;
}